

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

void Cec_ManSimCreateInfo(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  
  if ((p->pPars->fSeqSimulate == 0) || (p->pAig->nRegs < 1)) {
    if (0 < p->pAig->vCis->nSize) {
      lVar10 = 0;
      do {
        if (vInfoCis->nSize <= lVar10) goto LAB_005a283b;
        if (0 < p->nWords) {
          pvVar1 = vInfoCis->pArray[lVar10];
          lVar7 = 0;
          do {
            uVar3 = Gia_ManRandom(0);
            *(uint *)((long)pvVar1 + lVar7 * 4) = uVar3;
            lVar7 = lVar7 + 1;
          } while (lVar7 < p->nWords);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < p->pAig->vCis->nSize);
    }
  }
  else {
    if ((vInfoCis == (Vec_Ptr_t *)0x0) || (vInfoCos == (Vec_Ptr_t *)0x0)) {
      __assert_fail("vInfoCis && vInfoCos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                    ,0x32e,"void Cec_ManSimCreateInfo(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    pGVar4 = p->pAig;
    pVVar5 = pGVar4->vCis;
    if (pGVar4->nRegs < pVVar5->nSize) {
      lVar10 = 0;
      do {
        if (vInfoCis->nSize <= lVar10) goto LAB_005a283b;
        if (0 < p->nWords) {
          pvVar1 = vInfoCis->pArray[lVar10];
          lVar7 = 0;
          do {
            uVar3 = Gia_ManRandom(0);
            *(uint *)((long)pvVar1 + lVar7 * 4) = uVar3;
            lVar7 = lVar7 + 1;
          } while (lVar7 < p->nWords);
        }
        lVar10 = lVar10 + 1;
        pGVar4 = p->pAig;
        pVVar5 = pGVar4->vCis;
      } while (lVar10 < (long)pVVar5->nSize - (long)pGVar4->nRegs);
    }
    iVar8 = pGVar4->nRegs;
    if (0 < iVar8) {
      iVar6 = 0;
      do {
        uVar3 = (pVVar5->nSize - iVar8) + iVar6;
        if (((((int)uVar3 < 0) || (vInfoCis->nSize <= (int)uVar3)) ||
            (uVar9 = (pGVar4->vCos->nSize - iVar8) + iVar6, (int)uVar9 < 0)) ||
           (vInfoCos->nSize <= (int)uVar9)) {
LAB_005a283b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (0 < p->nWords) {
          pvVar1 = vInfoCis->pArray[uVar3];
          pvVar2 = vInfoCos->pArray[uVar9];
          lVar10 = 0;
          do {
            *(undefined4 *)((long)pvVar1 + lVar10 * 4) = *(undefined4 *)((long)pvVar2 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 < p->nWords);
        }
        iVar6 = iVar6 + 1;
        iVar8 = pGVar4->nRegs;
      } while (iVar6 < iVar8);
    }
  }
  return;
}

Assistant:

void Cec_ManSimCreateInfo( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    unsigned * pRes0, * pRes1;
    int i, w;
    if ( p->pPars->fSeqSimulate && Gia_ManRegNum(p->pAig) > 0 )
    {
        assert( vInfoCis && vInfoCos );
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, Gia_ManPiNum(p->pAig) + i );
            pRes1 = (unsigned *)Vec_PtrEntry( vInfoCos, Gia_ManPoNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = pRes1[w];
        }
    }
    else 
    {
        for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
    }
}